

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDate __thiscall QDate::addYears(QDate *this,int nyears,QCalendar cal)

{
  bool bVar1;
  int iVar2;
  QDate QVar3;
  ulong uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  YearMonthDay YVar6;
  QCalendar local_58;
  QCalendar local_50;
  YearMonthDay local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar3.jd = -0x8000000000000000;
  local_58.d_ptr = cal.d_ptr;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    YVar6 = QCalendar::partsFromDate(&local_58,(QDate)this->jd);
    uVar4 = YVar6._0_8_ & 0xffffffff00000000;
    if (uVar4 != 0x8000000000000000) {
      uVar5 = YVar6.year + nyears;
      bVar1 = QCalendar::hasYearZero(&local_58);
      if (!bVar1) {
        if ((uVar5 == 0) || (0 < YVar6.year == (int)uVar5 < 1)) {
          uVar5 = (uVar5 - 1) + (uint)(0 < nyears) * 2;
        }
      }
      local_48._0_8_ = uVar4 | uVar5;
      local_50.d_ptr = local_58.d_ptr;
      local_48.day = YVar6.day;
      if ((int)uVar5 < 0) {
        bVar1 = QCalendar::isProleptic(&local_50);
        if (!bVar1) goto LAB_0034db4f;
      }
      if (local_48.year == 0) {
        bVar1 = QCalendar::hasYearZero(&local_50);
        if (!bVar1) goto LAB_0034db4f;
      }
      iVar2 = QCalendar::daysInMonth(&local_50,local_48.month,local_48.year);
      if (local_48.day < iVar2) {
        iVar2 = local_48.day;
      }
      local_48.day = iVar2;
      QVar3 = QCalendar::dateFromParts(&local_50,&local_48);
    }
  }
LAB_0034db4f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDate)QVar3.jd;
  }
  __stack_chk_fail();
}

Assistant:

QDate QDate::addYears(int nyears, QCalendar cal) const
{
    if (!isValid())
        return QDate();

    auto parts = cal.partsFromDate(*this);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if (!cal.hasYearZero() && ((old_y > 0) != (parts.year > 0) || !parts.year))
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts, cal);
}